

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::FBXConverter::ConvertMaterialForMesh
          (FBXConverter *this,aiMesh *out,Model *model,MeshGeometry *geo,
          value_type_conflict3 materialIndex)

{
  _Rb_tree_header *p_Var1;
  pointer ppMVar2;
  uint uVar3;
  _Base_ptr p_Var4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  Material *mat;
  Material *local_28;
  
  if (-1 < materialIndex) {
    ppMVar2 = (model->materials).
              super__Vector_base<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(uint)materialIndex <
        (ulong)((long)(model->materials).
                      super__Vector_base<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar2 >> 3)) {
      local_28 = ppMVar2[(uint)materialIndex];
      p_Var6 = (this->materials_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var6 == (_Base_ptr)0x0) {
LAB_00172035:
        uVar3 = ConvertMaterial(this,local_28,geo);
        out->mMaterialIndex = uVar3;
        pmVar5 = std::
                 map<const_Assimp::FBX::Material_*,_unsigned_int,_std::less<const_Assimp::FBX::Material_*>,_std::allocator<std::pair<const_Assimp::FBX::Material_*const,_unsigned_int>_>_>
                 ::operator[](&this->materials_converted,&local_28);
        *pmVar5 = uVar3;
        return;
      }
      p_Var1 = &(this->materials_converted)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = &p_Var1->_M_header;
      do {
        if (*(Material **)(p_Var6 + 1) >= local_28) {
          p_Var4 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[*(Material **)(p_Var6 + 1) < local_28];
      } while (p_Var6 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var4 == p_Var1) || (local_28 < *(Material **)(p_Var4 + 1)))
      goto LAB_00172035;
      uVar3 = *(uint *)&p_Var4[1]._M_parent;
      goto LAB_00172072;
    }
  }
  LogFunctions<Assimp::FBXImporter>::LogError((char *)0x17206a);
  uVar3 = GetDefaultMaterial(this);
LAB_00172072:
  out->mMaterialIndex = uVar3;
  return;
}

Assistant:

void FBXConverter::ConvertMaterialForMesh(aiMesh* out, const Model& model, const MeshGeometry& geo,
            MatIndexArray::value_type materialIndex)
        {
            // locate source materials for this mesh
            const std::vector<const Material*>& mats = model.GetMaterials();
            if (static_cast<unsigned int>(materialIndex) >= mats.size() || materialIndex < 0) {
                FBXImporter::LogError("material index out of bounds, setting default material");
                out->mMaterialIndex = GetDefaultMaterial();
                return;
            }

            const Material* const mat = mats[materialIndex];
            MaterialMap::const_iterator it = materials_converted.find(mat);
            if (it != materials_converted.end()) {
                out->mMaterialIndex = (*it).second;
                return;
            }

            out->mMaterialIndex = ConvertMaterial(*mat, &geo);
            materials_converted[mat] = out->mMaterialIndex;
        }